

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O0

int Filter::fnmatch(char *__pattern,char *__name,int __flags)

{
  string *this;
  char *__pattern_00;
  char *__name_00;
  Error *this_00;
  int *piVar1;
  int __flags_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  char *local_148 [3];
  char *local_130;
  char *local_128;
  string local_120;
  int local_100;
  byte local_f9;
  int rval;
  bool icase_local;
  string *string_local;
  string *pattern_local;
  undefined1 local_c8 [16];
  v10 *local_b8;
  char *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  string *local_a0;
  v10 *local_98;
  char *pcStack_90;
  string *local_88;
  char *local_80;
  char **local_78;
  v10 **local_70;
  v10 *local_68;
  char *pcStack_60;
  string **local_50;
  undefined1 *local_48;
  string **local_40;
  string **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  char *local_20;
  char **local_18;
  char *local_10;
  
  local_f9 = (byte)__flags & 1;
  _rval = __name;
  string_local = (string *)__pattern;
  __pattern_00 = (char *)std::__cxx11::string::c_str();
  __name_00 = (char *)std::__cxx11::string::c_str();
  __flags_00 = 0;
  if ((local_f9 & 1) != 0) {
    __flags_00 = 0x10;
  }
  local_100 = ::fnmatch(__pattern_00,__name_00,__flags_00);
  if ((local_100 != 0) && (local_100 != 1)) {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    local_78 = &local_130;
    local_80 = "Invalid pattern \"{}\" : {}";
    local_20 = "Invalid pattern \"{}\" : {}";
    local_130 = "Invalid pattern \"{}\" : {}";
    local_18 = local_78;
    local_128 = (char *)std::char_traits<char>::length("Invalid pattern \"{}\" : {}");
    this = string_local;
    local_10 = local_80;
    piVar1 = __errno_location();
    local_148[0] = strerror(*piVar1);
    local_88 = &local_120;
    local_98 = (v10 *)local_130;
    pcStack_90 = local_128;
    local_a0 = this;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148;
    local_70 = &local_98;
    local_b8 = (v10 *)local_130;
    local_b0 = local_128;
    local_68 = local_b8;
    pcStack_60 = local_b0;
    ::fmt::v10::
    make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const,char*>
              ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                *)&pattern_local,(v10 *)this,local_a8,(char **)local_130);
    local_48 = local_c8;
    local_50 = &pattern_local;
    local_30 = 0xcd;
    fmt.size_ = 0xcd;
    fmt.data_ = local_b0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_50;
    local_40 = local_50;
    local_38 = local_50;
    local_28 = local_48;
    ::fmt::v10::vformat_abi_cxx11_(&local_120,local_b8,fmt,args);
    Error::Error(this_00,&local_120);
    __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
  }
  return CONCAT31((int3)((uint)local_100 >> 8),local_100 == 0);
}

Assistant:

bool Filter::fnmatch(std::string const & pattern, std::string const & string, bool icase)
{
#if defined(_UNIX)
	// POSIX fnmatch
	int const rval = ::fnmatch(pattern.c_str(), string.c_str(), icase ? FNM_CASEFOLD : 0);
	if (rval != 0 && rval != FNM_NOMATCH) {
		THROW_ERROR("Invalid pattern \"{}\" : {}", pattern, strerror(errno));
	}
	return (rval == 0);
#endif
#if defined(_WIN32)
	return PathMatchSpecA(string.c_str(), pattern.c_str());
#endif
}